

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanRegExpConstantNoAST
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,ArenaAllocator *alloc)

{
  ThreadContext *this_00;
  code *pcVar1;
  bool bVar2;
  StandardChars<unsigned_char> *standardEncodedChars;
  StandardChars<char16_t> *standardChars;
  RegexPattern *pRVar3;
  undefined4 *puVar4;
  undefined1 local_100 [8];
  Parser<UTF8EncodingPolicyBase<false>,_true> parser;
  CharCount local_40;
  CharCount local_3c;
  charcount_t totalChars;
  charcount_t bodyLen;
  charcount_t totalLen;
  charcount_t bodyChars;
  
  parser.deferredIfUnicodeError = (ParseError *)alloc;
  ThreadContext::ProbeStackNoDispose
            (this->m_scriptContext->threadContext,0x6000,this->m_scriptContext,(PVOID)0x0);
  this_00 = this->m_scriptContext->threadContext;
  standardEncodedChars = ThreadContext::GetStandardChars(this_00,(uint8 *)0x0);
  standardChars = ThreadContext::GetStandardChars(this_00,(char16 *)0x0);
  totalChars = 0;
  bodyLen = 0;
  local_40 = 0;
  local_3c = 0;
  UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::Parser
            ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_100,this->m_scriptContext,
             (ArenaAllocator *)parser.deferredIfUnicodeError,standardEncodedChars,standardChars,
             ((this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions &
             doAllowThreeByteSurrogates) == doDefault,(DebugWriter *)0x0);
  UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::ParseLiteralNoAST
            ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_100,this->m_currentCharacter,
             this->m_pchLast,&local_3c,&totalChars,&bodyLen,&local_40);
  pRVar3 = UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::CompileProgram<false>
                     ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_100,(Node *)0x0,
                      &this->m_currentCharacter,totalChars,bodyLen,local_3c,local_40,NoRegexFlags);
  if (pRVar3 != (RegexPattern *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x3af,"(pattern == nullptr)","pattern == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits =
       (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits + (long)local_100;
  this->m_ptoken->tk = tkRegExp;
  return tkRegExp;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanRegExpConstantNoAST(ArenaAllocator* alloc)
{
    PROBE_STACK_NO_DISPOSE(m_scriptContext, Js::Constants::MinStackRegex);

    ThreadContext *threadContext = m_scriptContext->GetThreadContext();
    UnifiedRegex::StandardChars<EncodedChar>* standardEncodedChars = threadContext->GetStandardChars((EncodedChar*)0);
    UnifiedRegex::StandardChars<char16>* standardChars = threadContext->GetStandardChars((char16*)0);
    charcount_t totalLen = 0, bodyChars = 0, totalChars = 0, bodyLen = 0;
    UnifiedRegex::Parser<EncodingPolicy, true> parser
            ( m_scriptContext
            , alloc
            , standardEncodedChars
            , standardChars
            , this->IsUtf8()
#if ENABLE_REGEX_CONFIG_OPTIONS
            , 0
#endif
            );
    try
    {
        parser.ParseLiteralNoAST(m_currentCharacter, m_pchLast, bodyLen, totalLen, bodyChars, totalChars);
    }
    catch (UnifiedRegex::ParseError e)
    {
        m_currentCharacter += e.encodedPos;
        Error(e.error);
        // never reached
    }

    UnifiedRegex::RegexPattern* pattern = parser.template CompileProgram<false>(nullptr, m_currentCharacter, totalLen, bodyChars, bodyLen, totalChars, UnifiedRegex::NoRegexFlags);
    Assert(pattern == nullptr);  // BuildAST == false, CompileProgram should return nullptr
    this->RestoreMultiUnits(this->m_cMultiUnits + parser.GetMultiUnits()); // m_currentCharacter changed, sync MultiUnits

    return (m_ptoken->tk = tkRegExp);

}